

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O2

void __thiscall cmStdIoConnection::SetServer(cmStdIoConnection *this,cmServerBase *s)

{
  cmConnection::SetServer((cmConnection *)this,s);
  if (s != (cmServerBase *)0x0) {
    SetupStream((cmStdIoConnection *)&stack0xffffffffffffffe0,(int)this);
    std::__shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2> *)&this->ReadStream,
               (__shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
    ::cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_stream_s> *)&stack0xffffffffffffffe0);
    SetupStream((cmStdIoConnection *)&stack0xffffffffffffffe0,(int)this);
    std::__shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_cmEventBasedConnection).WriteStream,
               (__shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
    ::cm::uv_handle_ptr_base_<uv_stream_s>::~uv_handle_ptr_base_
              ((uv_handle_ptr_base_<uv_stream_s> *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void cmStdIoConnection::SetServer(cmServerBase* s)
{
  cmConnection::SetServer(s);
  if (!s) {
    return;
  }

  this->ReadStream = SetupStream(0);
  this->WriteStream = SetupStream(1);
}